

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_id(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  gtoken_s token_00;
  char *identifier;
  gnode_t *pgVar1;
  gnode_t *local_98;
  gtoken_s local_80;
  undefined8 uStack_58;
  gtoken_s token;
  char *pcStack_28;
  gtoken_t peek;
  char *identifier2;
  char *identifier1;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  pcStack_28 = (char *)0x0;
  identifier = parse_identifier(parser);
  gravity_lexer_token(&local_80,lexer_00);
  memcpy(&uStack_58,&local_80,0x28);
  token.value._4_4_ = gravity_lexer_peek(lexer_00);
  if (token.value._4_4_ == TOK_OP_DOT) {
    gravity_lexer_next(lexer_00);
    pcStack_28 = parse_identifier(parser);
  }
  if (parser->declarations->n == 0) {
    local_98 = (gnode_t *)0x0;
  }
  else {
    local_98 = parser->declarations->p[parser->declarations->n - 1];
  }
  token_00.colno = token.type;
  token_00.position = token.lineno;
  token_00.type = (undefined4)uStack_58;
  token_00.lineno = uStack_58._4_4_;
  token_00.bytes = token.colno;
  token_00.length = token.position;
  token_00.fileid = token.bytes;
  token_00.builtin = token.length;
  token_00.value = (char *)token._24_8_;
  pgVar1 = gnode_identifier_expr_create(token_00,identifier,pcStack_28,local_98);
  return pgVar1;
}

Assistant:

static gnode_t *parse_id (gravity_parser_t *parser) {
    DECLARE_LEXER;
    const char    *identifier1 = NULL;
    const char    *identifier2 = NULL;
    gtoken_t    peek;
    gtoken_s    token;

    // IDENTIFIER |    (IDENTIFIER)('.' IDENTIFIER)

    DEBUG_PARSER("parse_id");

    identifier1 = parse_identifier(parser);

    token = gravity_lexer_token(lexer);
    peek = gravity_lexer_peek(lexer);
    if (peek == TOK_OP_DOT) {
        gravity_lexer_next(lexer); // consume TOK_OP_DOT
        identifier2 = parse_identifier(parser);
    }

    DEBUG_PARSER("ID: %s %s", identifier1, (identifier2) ? identifier2 : "");
    return gnode_identifier_expr_create(token, identifier1, identifier2, LAST_DECLARATION());
}